

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

int arg(int argc,char **argv,int *i)

{
  int iVar1;
  Fl_Plugin *pFVar2;
  int r;
  Fl_Commandline_Plugin *pi;
  int local_3c;
  int n;
  int j;
  Fl_Plugin_Manager pm;
  int *i_local;
  char **argv_local;
  int argc_local;
  
  if ((argv[*i][1] == 'u') && (argv[*i][2] == '\0')) {
    update_file = update_file + 1;
    batch_mode = batch_mode + 1;
    *i = *i + 1;
    argv_local._4_4_ = 1;
  }
  else if ((argv[*i][1] == 'c') && (argv[*i][2] == '\0')) {
    compile_file = compile_file + 1;
    batch_mode = batch_mode + 1;
    *i = *i + 1;
    argv_local._4_4_ = 1;
  }
  else if (((argv[*i][1] == 'c') && (argv[*i][2] == 's')) && (argv[*i][3] == '\0')) {
    compile_file = compile_file + 1;
    compile_strings = compile_strings + 1;
    batch_mode = batch_mode + 1;
    *i = *i + 1;
    argv_local._4_4_ = 1;
  }
  else if (((argv[*i][1] == 'o') && (argv[*i][2] == '\0')) && (*i + 1 < argc)) {
    code_file_name = argv[*i + 1];
    code_file_set = 1;
    *i = *i + 2;
    argv_local._4_4_ = 2;
  }
  else if ((argv[*i][1] == 'h') && (argv[*i][2] == '\0')) {
    header_file_name = argv[*i + 1];
    header_file_set = 1;
    *i = *i + 2;
    argv_local._4_4_ = 2;
  }
  else {
    pm.super_Fl_Preferences.rootNode = (RootNode *)i;
    Fl_Plugin_Manager::Fl_Plugin_Manager((Fl_Plugin_Manager *)&n,"commandline");
    iVar1 = Fl_Plugin_Manager::plugins((Fl_Plugin_Manager *)&n);
    for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
      pFVar2 = Fl_Plugin_Manager::plugin((Fl_Plugin_Manager *)&n,local_3c);
      argv_local._4_4_ =
           (*pFVar2->_vptr_Fl_Plugin[5])
                     (pFVar2,(ulong)(uint)argc,argv,pm.super_Fl_Preferences.rootNode);
      if (argv_local._4_4_ != 0) goto LAB_001c147e;
    }
    argv_local._4_4_ = 0;
LAB_001c147e:
    Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&n);
  }
  return argv_local._4_4_;
}

Assistant:

static int arg(int argc, char** argv, int& i) {
  if (argv[i][1] == 'u' && !argv[i][2]) {update_file++; batch_mode++; i++; return 1;}
  if (argv[i][1] == 'c' && !argv[i][2]) {compile_file++; batch_mode++; i++; return 1;}
  if (argv[i][1] == 'c' && argv[i][2] == 's' && !argv[i][3]) {compile_file++; compile_strings++; batch_mode++; i++; return 1;}
  if (argv[i][1] == 'o' && !argv[i][2] && i+1 < argc) {
    code_file_name = argv[i+1];
    code_file_set  = 1;
    i += 2;
    return 2;
  }
  if (argv[i][1] == 'h' && !argv[i][2]) {
    header_file_name = argv[i+1];
    header_file_set  = 1;
    i += 2;
    return 2;
  }
  Fl_Plugin_Manager pm("commandline");
  int j, n = pm.plugins();
  for (j=0; j<n; j++) {
    Fl_Commandline_Plugin *pi = (Fl_Commandline_Plugin*)pm.plugin(j);
    int r = pi->arg(argc, argv, i);
    if (r) return r;
  }
  return 0;
}